

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O1

bool __thiscall cmProcess::Buffer::GetLine(Buffer *this,string *line)

{
  pointer pcVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  ptrdiff_t _Num;
  size_t __n;
  long lVar6;
  pointer __src;
  bool bVar7;
  
  pcVar1 = (this->super_vector<char,_std::allocator<char>_>).
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  sVar5 = (long)(this->super_vector<char,_std::allocator<char>_>).
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pcVar1;
  sVar4 = this->Last;
  bVar7 = sVar4 != sVar5;
  if (bVar7) {
    do {
      if ((pcVar1[sVar4] == '\n') || (pcVar1[sVar4] == '\0')) {
        lVar6 = sVar4 - this->First;
        if (lVar6 == 0) goto LAB_001e9f1c;
        pcVar3 = pcVar1 + sVar4;
        goto LAB_001e9f0c;
      }
      bVar7 = sVar5 - 1 != sVar4;
      sVar4 = sVar4 + 1;
      this->Last = sVar4;
    } while (sVar5 != sVar4);
  }
  goto LAB_001e9f3f;
  while (lVar6 = lVar6 + -1, lVar6 != 0) {
LAB_001e9f0c:
    pcVar3 = pcVar3 + -1;
    if (*pcVar3 != '\r') break;
  }
LAB_001e9f1c:
  std::__cxx11::string::_M_replace
            ((ulong)line,0,(char *)line->_M_string_length,(ulong)(pcVar1 + this->First));
  sVar4 = this->Last + 1;
  this->Last = sVar4;
  this->First = sVar4;
  if (bVar7 != false) {
    return bVar7;
  }
LAB_001e9f3f:
  if (this->First != 0) {
    pcVar1 = (this->super_vector<char,_std::allocator<char>_>).
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    __src = pcVar1 + this->First;
    __n = (long)(this->super_vector<char,_std::allocator<char>_>).
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)__src;
    if (__n != 0) {
      memmove(pcVar1,__src,__n);
    }
    pcVar2 = (this->super_vector<char,_std::allocator<char>_>).
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pcVar2 != pcVar1 + ((long)pcVar2 - (long)__src)) {
      (this->super_vector<char,_std::allocator<char>_>).
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           pcVar1 + ((long)pcVar2 - (long)__src);
    }
    this->First = 0;
    this->Last = (long)(this->super_vector<char,_std::allocator<char>_>).
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->super_vector<char,_std::allocator<char>_>).
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
  }
  return bVar7;
}

Assistant:

bool cmProcess::Buffer::GetLine(std::string& line)
{
  // Scan for the next newline.
  for (size_type sz = this->size(); this->Last != sz; ++this->Last) {
    if ((*this)[this->Last] == '\n' || (*this)[this->Last] == '\0') {
      // Extract the range first..last as a line.
      const char* text = this->data() + this->First;
      size_type length = this->Last - this->First;
      while (length && text[length - 1] == '\r') {
        length--;
      }
      line.assign(text, length);

      // Start a new range for the next line.
      ++this->Last;
      this->First = Last;

      // Return the line extracted.
      return true;
    }
  }

  // Available data have been exhausted without a newline.
  if (this->First != 0) {
    // Move the partial line to the beginning of the buffer.
    this->erase(this->begin(), this->begin() + this->First);
    this->First = 0;
    this->Last = this->size();
  }
  return false;
}